

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

rule * Rule_merge(rule *pA,rule *pB)

{
  rule *prVar1;
  rule **pprVar2;
  rule *prVar3;
  bool bVar4;
  rule *pFirst;
  
  pFirst = (rule *)0x0;
  bVar4 = pA != (rule *)0x0;
  if (pB == (rule *)0x0 || !bVar4) {
    pprVar2 = &pFirst;
  }
  else {
    pprVar2 = &pFirst;
    prVar3 = pB;
    do {
      if (pA->iRule < prVar3->iRule) {
        *pprVar2 = pA;
        prVar1 = pA;
        pB = prVar3;
        pA = pA->next;
      }
      else {
        *pprVar2 = prVar3;
        pB = prVar3->next;
        prVar1 = prVar3;
      }
      pprVar2 = &prVar1->next;
      bVar4 = pA != (rule *)0x0;
    } while ((bVar4) && (prVar3 = pB, pB != (rule *)0x0));
  }
  if (!bVar4) {
    pA = pB;
  }
  *pprVar2 = pA;
  return pFirst;
}

Assistant:

static struct rule *Rule_merge(struct rule *pA, struct rule *pB){
  struct rule *pFirst = 0;
  struct rule **ppPrev = &pFirst;
  while( pA && pB ){
    if( pA->iRule<pB->iRule ){
      *ppPrev = pA;
      ppPrev = &pA->next;
      pA = pA->next;
    }else{
      *ppPrev = pB;
      ppPrev = &pB->next;
      pB = pB->next;
    }
  }
  if( pA ){
    *ppPrev = pA;
  }else{
    *ppPrev = pB;
  }
  return pFirst;
}